

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlTestReporter.cpp
# Opt level: O1

void __thiscall
UnitTest::XmlTestReporter::BeginResults
          (XmlTestReporter *this,ostream *os,int totalTestCount,int failedTestCount,int failureCount
          ,float secondsElapsed)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"<unittest-results",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(os," tests=\"",8);
  poVar1 = (ostream *)std::ostream::operator<<(os,totalTestCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," failedtests=\"",0xe);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,failedTestCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," failures=\"",0xb);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,failureCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," time=\"",7);
  poVar1 = std::ostream::_M_insert<double>((double)secondsElapsed);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,">",1);
  return;
}

Assistant:

void XmlTestReporter::BeginResults(std::ostream& os, int totalTestCount, int failedTestCount, 
                                   int failureCount, float secondsElapsed)
{
   os << "<unittest-results"
       << " tests=\"" << totalTestCount << "\"" 
       << " failedtests=\"" << failedTestCount << "\"" 
       << " failures=\"" << failureCount << "\"" 
       << " time=\"" << secondsElapsed << "\""
       << ">";
}